

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O1

void Handlers::Trade_Accept(Character *character,PacketReader *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_short uVar2;
  int iVar3;
  Character *this;
  PacketBuilder builder;
  string local_68;
  PacketBuilder local_48;
  
  if ((character->trading == false) && ((character->nointeract & 2) == 0)) {
    PacketReader::GetChar(reader);
    uVar2 = PacketReader::GetShort(reader);
    this = Map::GetCharacterPID(character->map,(uint)uVar2);
    if (((this != (Character *)0x0) &&
        (((this->mapid == character->mapid && (this->trade_partner == character)) &&
         (this->trading == false)))) && ((this->nointeract & 2) == 0)) {
      PacketBuilder::PacketBuilder(&local_48,PACKET_TRADE,PACKET_OPEN,0x1e);
      iVar3 = Character::PlayerID(this);
      PacketBuilder::AddShort(&local_48,(unsigned_short)iVar3);
      (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_68,this);
      PacketBuilder::AddBreakString(&local_48,&local_68,0xff);
      paVar1 = &local_68.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      iVar3 = Character::PlayerID(character);
      PacketBuilder::AddShort(&local_48,(unsigned_short)iVar3);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_68,character);
      PacketBuilder::AddBreakString(&local_48,&local_68,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      Character::Send(character,&local_48);
      PacketBuilder::Reset(&local_48,0x1e);
      iVar3 = Character::PlayerID(character);
      PacketBuilder::AddShort(&local_48,(unsigned_short)iVar3);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_68,character);
      PacketBuilder::AddBreakString(&local_48,&local_68,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      iVar3 = Character::PlayerID(this);
      PacketBuilder::AddShort(&local_48,(unsigned_short)iVar3);
      (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_68,this);
      PacketBuilder::AddBreakString(&local_48,&local_68,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      Character::Send(this,&local_48);
      character->trade_partner = this;
      character->trading = true;
      character->trade_agree = false;
      this->trading = true;
      this->trade_agree = false;
      PacketBuilder::~PacketBuilder(&local_48);
    }
  }
  return;
}

Assistant:

void Trade_Accept(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int accept =*/ reader.GetChar();
	int victimid = reader.GetShort();

	Character *victim(character->map->GetCharacterPID(victimid));

	if (victim && victim->mapid == character->mapid && victim->trade_partner == character
	 && !victim->trading && victim->CanInteractItems())
	{
		PacketBuilder builder(PACKET_TRADE, PACKET_OPEN, 30);
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		character->Send(builder);

		builder.Reset(30);
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		victim->Send(builder);

		character->trade_partner = victim;
		character->trading = true;
		character->trade_agree = false;
		victim->trading = true;
		victim->trade_agree = false;
	}
}